

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall FormatterTest_Precision_Test::TestBody(FormatterTest_Precision_Test *this)

{
  AssertHelperData *pAVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_string_view<char> format_str_15;
  basic_string_view<char> format_str_16;
  basic_string_view<char> format_str_17;
  basic_string_view<char> format_str_18;
  basic_string_view<char> format_str_19;
  basic_string_view<char> format_str_20;
  basic_string_view<char> format_str_21;
  basic_string_view<char> format_str_22;
  basic_string_view<char> format_str_23;
  basic_string_view<char> format_str_24;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_08;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_09;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_10;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_11;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_12;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_13;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_14;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_15;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_16;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_17;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_18;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_19;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_20;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_21;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_22;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_23;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_24;
  char format_str [256];
  AssertionResult local_7b8;
  undefined1 local_7a8 [32];
  undefined8 local_788;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_780 [2];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_770;
  undefined1 *local_768;
  long lStack_760;
  undefined8 local_758;
  undefined1 local_750 [504];
  internal local_558 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_550;
  undefined1 *local_548 [2];
  undefined1 local_538 [16];
  undefined1 *local_528 [2];
  undefined1 local_518 [16];
  undefined1 *local_508 [2];
  undefined1 local_4f8 [16];
  undefined1 *local_4e8 [2];
  undefined1 local_4d8 [16];
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [16];
  undefined1 *local_4a8 [2];
  undefined1 local_498 [16];
  undefined1 *local_488 [2];
  undefined1 local_478 [16];
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  undefined1 *local_428 [2];
  undefined1 local_418 [16];
  undefined1 *local_408 [2];
  undefined1 local_3f8 [16];
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined8 local_288 [2];
  undefined8 local_278 [2];
  undefined8 local_268 [2];
  undefined8 local_258 [2];
  undefined8 local_248 [2];
  undefined8 local_238 [2];
  undefined8 local_228 [2];
  undefined8 local_218 [2];
  undefined8 local_208 [2];
  undefined8 local_1f8 [2];
  undefined8 local_1e8 [2];
  undefined8 local_1d8 [2];
  undefined8 local_1c8 [2];
  undefined8 local_1b8 [2];
  undefined8 local_1a8 [2];
  undefined8 local_198 [2];
  undefined8 local_188 [2];
  undefined8 local_178 [2];
  undefined8 local_168 [2];
  undefined8 local_158 [2];
  undefined8 local_148 [2];
  char local_138 [4];
  char local_134 [260];
  
  safe_sprintf<256ul>((char (*) [256])local_138,"{0:.%u",0xffffffff);
  increment(local_134);
  testing::AssertionSuccess();
  pAVar1 = (AssertHelperData *)(local_7a8 + 0x10);
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"number is too big","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      sVar3 = strlen(local_138);
      local_288[0] = 0;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_00.size_ = sVar3;
      format_str_00.data_ = local_138;
      args.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_288;
      args.types_ = fmt::v5::
                    format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                    ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_00,args,(locale_ref)0x0);
      local_2a8[0] = local_298;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2a8,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x49b,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  sVar3 = strlen(local_138);
  (local_138 + sVar3)[0] = '}';
  (local_138 + sVar3)[1] = '\0';
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"number is too big","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      sVar3 = strlen(local_138);
      local_278[0] = 0;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_01.size_ = sVar3;
      format_str_01.data_ = local_138;
      args_00.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_278;
      args_00.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_01,args_00,(locale_ref)0x0);
      local_2c8[0] = local_2b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c8,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_2c8[0] != local_2b8) {
        operator_delete(local_2c8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x49f,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  safe_sprintf<256ul>((char (*) [256])local_138,"{0:.%u",0x80000000);
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"number is too big","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      sVar3 = strlen(local_138);
      local_268[0] = 0;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_02.size_ = sVar3;
      format_str_02.data_ = local_138;
      args_01.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_268;
      args_01.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_02,args_01,(locale_ref)0x0);
      local_2e8[0] = local_2d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2e8,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_2e8[0] != local_2d8) {
        operator_delete(local_2e8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4a2,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  safe_sprintf<256ul>((char (*) [256])local_138,"{0:.%u}",0x80000000);
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"number is too big","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      sVar3 = strlen(local_138);
      local_258[0] = 0;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_03.size_ = sVar3;
      format_str_03.data_ = local_138;
      args_02.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_258;
      args_02.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_03,args_02,(locale_ref)0x0);
      local_308[0] = local_2f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_308,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_308[0] != local_2f8) {
        operator_delete(local_308[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4a4,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"missing precision specifier","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_248[0] = 0;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_04.size_ = 4;
      format_str_04.data_ = "{0:.";
      args_03.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_248;
      args_03.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_04,args_03,(locale_ref)0x0);
      local_328[0] = local_318;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_328,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_328[0] != local_318) {
        operator_delete(local_328[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [99])
               "Expected: format(\"{0:.\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4a7,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"missing precision specifier","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_238[0] = 0;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_05.size_ = 5;
      format_str_05.data_ = "{0:.}";
      args_04.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_238;
      args_04.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_05,args_04,(locale_ref)0x0);
      local_348[0] = local_338;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_348,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_348[0] != local_338) {
        operator_delete(local_348[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [100])
               "Expected: format(\"{0:.}\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4a9,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_228[0] = 0;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_06.size_ = 5;
      format_str_06.data_ = "{0:.2";
      args_05.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_228;
      args_05.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_06,args_05,(locale_ref)0x0);
      local_368[0] = local_358;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_368,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_368[0] != local_358) {
        operator_delete(local_368[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [100])
               "Expected: format(\"{0:.2\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4ac,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_218[0] = 0x2a;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_07.size_ = 6;
      format_str_07.data_ = "{0:.2}";
      args_06.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_218;
      args_06.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_07,args_06,(locale_ref)0x0);
      local_388[0] = local_378;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_388,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_388[0] != local_378) {
        operator_delete(local_388[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [102])
               "Expected: format(\"{0:.2}\", 42) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4ae,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_208[0] = 0x2a;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_08.size_ = 7;
      format_str_08.data_ = "{0:.2f}";
      args_07.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_208;
      args_07.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_08,args_07,(locale_ref)0x0);
      local_3a8[0] = local_398;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3a8,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_3a8[0] != local_398) {
        operator_delete(local_3a8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [103])
               "Expected: format(\"{0:.2f}\", 42) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4b0,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_1f8[0] = 0x2a;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_09.size_ = 6;
      format_str_09.data_ = "{0:.2}";
      args_08.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_1f8;
      args_08.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_09,args_08,(locale_ref)0x0);
      local_3c8[0] = local_3b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3c8,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_3c8[0] != local_3b8) {
        operator_delete(local_3c8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [103])
               "Expected: format(\"{0:.2}\", 42u) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4b2,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_1e8[0] = 0x2a;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_10.size_ = 7;
      format_str_10.data_ = "{0:.2f}";
      args_09.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_1e8;
      args_09.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_10,args_09,(locale_ref)0x0);
      local_3e8[0] = local_3d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3e8,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_3e8[0] != local_3d8) {
        operator_delete(local_3e8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [104])
               "Expected: format(\"{0:.2f}\", 42u) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4b4,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_1d8[0] = 0x2a;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_11.size_ = 6;
      format_str_11.data_ = "{0:.2}";
      args_10.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_1d8;
      args_10.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_11,args_10,(locale_ref)0x0);
      local_408[0] = local_3f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_408[0] != local_3f8) {
        operator_delete(local_408[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [103])
               "Expected: format(\"{0:.2}\", 42l) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4b6,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_1c8[0] = 0x2a;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_12.size_ = 7;
      format_str_12.data_ = "{0:.2f}";
      args_11.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_1c8;
      args_11.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_12,args_11,(locale_ref)0x0);
      local_428[0] = local_418;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_428,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_428[0] != local_418) {
        operator_delete(local_428[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [104])
               "Expected: format(\"{0:.2f}\", 42l) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4b8,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_1b8[0] = 0x2a;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_13.size_ = 6;
      format_str_13.data_ = "{0:.2}";
      args_12.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_1b8;
      args_12.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_13,args_12,(locale_ref)0x0);
      local_448[0] = local_438;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_448,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_448[0] != local_438) {
        operator_delete(local_448[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [104])
               "Expected: format(\"{0:.2}\", 42ul) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4ba,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_1a8[0] = 0x2a;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_14.size_ = 7;
      format_str_14.data_ = "{0:.2f}";
      args_13.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_1a8;
      args_13.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_14,args_13,(locale_ref)0x0);
      local_468[0] = local_458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_468[0] != local_458) {
        operator_delete(local_468[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [105])
               "Expected: format(\"{0:.2f}\", 42ul) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4bc,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_198[0] = 0x2a;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_15.size_ = 6;
      format_str_15.data_ = "{0:.2}";
      args_14.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_198;
      args_14.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_long>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_15,args_14,(locale_ref)0x0);
      local_488[0] = local_478;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_488,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_488[0] != local_478) {
        operator_delete(local_488[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [104])
               "Expected: format(\"{0:.2}\", 42ll) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4be,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_188[0] = 0x2a;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_16.size_ = 7;
      format_str_16.data_ = "{0:.2f}";
      args_15.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_188;
      args_15.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_long>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_16,args_15,(locale_ref)0x0);
      local_4a8[0] = local_498;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_4a8[0] != local_498) {
        operator_delete(local_4a8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [105])
               "Expected: format(\"{0:.2f}\", 42ll) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4c0,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_178[0] = 0x2a;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_17.size_ = 6;
      format_str_17.data_ = "{0:.2}";
      args_16.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_178;
      args_16.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long_long>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_17,args_16,(locale_ref)0x0);
      local_4c8[0] = local_4b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4c8,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_4c8[0] != local_4b8) {
        operator_delete(local_4c8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [105])
               "Expected: format(\"{0:.2}\", 42ull) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4c2,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_168[0] = 0x2a;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_18.size_ = 7;
      format_str_18.data_ = "{0:.2f}";
      args_17.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_168;
      args_17.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long_long>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_18,args_17,(locale_ref)0x0);
      local_4e8[0] = local_4d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4e8,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_4e8[0] != local_4d8) {
        operator_delete(local_4e8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [106])
               "Expected: format(\"{0:.2f}\", 42ull) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4c4,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_158[0] = 0x78;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_19.size_ = 7;
      format_str_19.data_ = "{0:3.0}";
      args_18.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_158;
      args_18.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_19,args_18,(locale_ref)0x0);
      local_508[0] = local_4f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_508,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_508[0] != local_4f8) {
        operator_delete(local_508[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [104])
               "Expected: format(\"{0:3.0}\", \'x\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4c6,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_7b8.success_ = true;
  local_7b8._1_7_ = 0x3ff3c083126e97;
  lStack_760 = 0;
  local_770.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_758 = 500;
  format_str_20.size_ = 6;
  format_str_20.data_ = "{0:.2}";
  args_19.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_7b8;
  args_19.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double>
       ::TYPES;
  local_768 = local_750;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_770,format_str_20,args_19,(locale_ref)0x0);
  local_7a8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7a8,local_768,local_768 + lStack_760);
  local_770.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_768 != local_750) {
    operator_delete(local_768);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_788,"\"1.2\"","format(\"{0:.2}\", 1.2345)",(char (*) [4])0x24890d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a8);
  if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
    operator_delete((void *)local_7a8._0_8_);
  }
  if (local_788._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_770);
    if (local_780[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_780[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x4c7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
    if (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_770.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_770.ptr_ + 8))();
      }
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_780,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_7b8.success_ = true;
  local_7b8._1_7_ = 0x9e04189374bc6a;
  local_7b8.message_.ptr_._0_2_ = 0x3fff;
  lStack_760 = 0;
  local_770.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_758 = 500;
  format_str_21.size_ = 6;
  format_str_21.data_ = "{0:.2}";
  args_20.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_7b8;
  args_20.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_double>
       ::TYPES;
  local_768 = local_750;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_770,format_str_21,args_20,(locale_ref)0x0);
  local_7a8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7a8,local_768,local_768 + lStack_760);
  local_770.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_768 != local_750) {
    operator_delete(local_768);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_788,"\"1.2\"","format(\"{0:.2}\", 1.2345l)",(char (*) [4])0x24890d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a8);
  if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
    operator_delete((void *)local_7a8._0_8_);
  }
  if (local_788._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_770);
    if (local_780[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_780[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x4c8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
    if (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_770.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_770.ptr_ + 8))();
      }
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_780,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_148[0] = 0xcafe;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_22.size_ = 6;
      format_str_22.data_ = "{0:.2}";
      args_21.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_148;
      args_21.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_22,args_21,(locale_ref)0x0);
      local_528[0] = local_518;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_528,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_528[0] != local_518) {
        operator_delete(local_528[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [131])
               "Expected: format(\"{0:.2}\", reinterpret_cast<void*>(0xcafe)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4cb,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_7b8.success_ == true) {
    local_7a8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_788 = 0xcafe;
      lStack_760 = 0;
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_758 = 500;
      format_str_23.size_ = 7;
      format_str_23.data_ = "{0:.2f}";
      args_22.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_788;
      args_22.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
           ::TYPES;
      local_768 = local_750;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_770,format_str_23,args_22,(locale_ref)0x0);
      local_548[0] = local_538;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_548,local_768,local_768 + lStack_760);
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_768 != local_750) {
        operator_delete(local_768);
      }
      if (local_548[0] != local_538) {
        operator_delete(local_548[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7b8,
               (char (*) [132])
               "Expected: format(\"{0:.2f}\", reinterpret_cast<void*>(0xcafe)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
      operator_delete((void *)local_7a8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_770);
  if ((undefined8 *)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)CONCAT62(local_7b8.message_.ptr_._2_6_,local_7b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4cd,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
  if (local_770.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_770.ptr_ + 8))();
    }
    local_770.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_7b8._0_8_ = "str";
  lStack_760 = 0;
  local_770.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_758 = 500;
  format_str_24.size_ = 6;
  format_str_24.data_ = "{0:.2}";
  args_23.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_7b8;
  args_23.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char[4]>
       ::TYPES;
  local_768 = local_750;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_770,format_str_24,args_23,(locale_ref)0x0);
  local_7a8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7a8,local_768,local_768 + lStack_760);
  local_770.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_768 != local_750) {
    operator_delete(local_768);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_558,"\"st\"","format(\"{0:.2}\", \"str\")",(char (*) [3])0x23ba22,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a8);
  if ((AssertHelperData *)local_7a8._0_8_ != pAVar1) {
    operator_delete((void *)local_7a8._0_8_);
  }
  if (local_558[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_770);
    if (local_550.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_550.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x4cf,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7a8,(Message *)&local_770);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7a8);
    if (local_770.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_770.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_770.ptr_ + 8))();
      }
      local_770.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_550,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatterTest, Precision) {
  char format_str[BUFFER_SIZE];
  safe_sprintf(format_str, "{0:.%u", UINT_MAX);
  increment(format_str + 4);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  std::size_t size = std::strlen(format_str);
  format_str[size] = '}';
  format_str[size + 1] = 0;
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");

  safe_sprintf(format_str, "{0:.%u", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  safe_sprintf(format_str, "{0:.%u}", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");

  EXPECT_THROW_MSG(format("{0:.", 0),
      format_error, "missing precision specifier");
  EXPECT_THROW_MSG(format("{0:.}", 0),
      format_error, "missing precision specifier");

  EXPECT_THROW_MSG(format("{0:.2", 0),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42u),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42u),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42l),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42l),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42ul),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42ul),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42ll),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42ll),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42ull),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42ull),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:3.0}", 'x'),
      format_error, "precision not allowed for this argument type");
  EXPECT_EQ("1.2", format("{0:.2}", 1.2345));
  EXPECT_EQ("1.2", format("{0:.2}", 1.2345l));

  EXPECT_THROW_MSG(format("{0:.2}", reinterpret_cast<void*>(0xcafe)),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", reinterpret_cast<void*>(0xcafe)),
      format_error, "precision not allowed for this argument type");

  EXPECT_EQ("st", format("{0:.2}", "str"));
}